

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O0

void Memory::XDataAllocator::Unregister(XDataAllocation *xdataInfo)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  XDataAllocation *xdataInfo_local;
  
  uVar3 = ReadHead((xdataInfo->super_SecondaryAllocation).address);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0xb3,"(ReadHead(xdataInfo->address))","ReadHead(xdataInfo->address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  __deregister_frame((xdataInfo->super_SecondaryAllocation).address);
  return;
}

Assistant:

void XDataAllocator::Unregister(XDataAllocation * xdataInfo)
{
#ifdef _WIN32
    if (!AutoSystemInfo::Data.IsWin8OrLater())
    {
        BOOLEAN success = RtlDeleteFunctionTable(&xdataInfo->pdata);
        Assert(success);
    }

#else  // !_WIN32
    Assert(ReadHead(xdataInfo->address));  // should be non-empty .eh_frame
    __DEREGISTER_FRAME(xdataInfo->address);
#endif
}